

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDocPtr xmlReadFd(int fd,char *URL,char *encoding,int options)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  undefined8 local_48;
  xmlDocPtr doc;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *encoding_local;
  char *URL_local;
  xmlDocPtr pxStack_10;
  int fd_local;
  
  local_48 = (xmlDocPtr)0x0;
  ctxt_00 = xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    pxStack_10 = (xmlDocPtr)0x0;
  }
  else {
    xmlCtxtUseOptions(ctxt_00,options);
    input_00 = xmlCtxtNewInputFromFd(ctxt_00,URL,fd,encoding,0);
    if (input_00 != (xmlParserInputPtr)0x0) {
      local_48 = xmlCtxtParseDocument(ctxt_00,input_00);
    }
    xmlFreeParserCtxt(ctxt_00);
    pxStack_10 = local_48;
  }
  return pxStack_10;
}

Assistant:

xmlDocPtr
xmlReadFd(int fd, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    xmlDocPtr doc = NULL;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
        return(NULL);

    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromFd(ctxt, URL, fd, encoding, 0);

    if (input != NULL)
        doc = xmlCtxtParseDocument(ctxt, input);

    xmlFreeParserCtxt(ctxt);
    return(doc);
}